

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Type * __thiscall slang::ast::MultiPortSymbol::getType(MultiPortSymbol *this)

{
  bitmask<slang::ast::ASTFlags> flags_00;
  SourceRange range;
  bool bVar1;
  bitwidth_t bVar2;
  Type *pTVar3;
  SyntaxNode *pSVar4;
  Compilation *this_00;
  iterator diag;
  iterator arg;
  Type *in_RDI;
  LookupLocation LVar5;
  SourceRange SVar6;
  Type *t;
  PortSymbol *port;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> *__range2;
  bitmask<slang::ast::IntegralFlags> flags;
  bitwidth_t totalWidth;
  ASTContext context;
  Compilation *comp;
  SyntaxNode *syntax;
  Scope *scope;
  PortSymbol *in_stack_00000118;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffff27;
  SourceLocation in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  DiagCode in_stack_ffffffffffffff34;
  SourceLocation in_stack_ffffffffffffff38;
  Type *this_01;
  bitmask<slang::ast::IntegralFlags> local_8d;
  int local_8c;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  bitwidth_t in_stack_ffffffffffffffd4;
  Type *local_8;
  
  if (in_RDI[1].super_Symbol.name._M_str == (char *)0x0) {
    pTVar3 = (Type *)Symbol::getParentScope(&in_RDI->super_Symbol);
    pSVar4 = Symbol::getSyntax(&in_RDI->super_Symbol);
    this_00 = Scope::getCompilation((Scope *)pTVar3);
    LVar5 = LookupLocation::before((Symbol *)pTVar3);
    local_80 = LVar5.scope;
    local_78 = LVar5.index;
    local_70 = local_80;
    local_68 = local_78;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_88,NonProcedural);
    LVar5.index = in_stack_ffffffffffffff30;
    LVar5.scope = (Scope *)in_stack_ffffffffffffff28;
    LVar5._12_2_ = in_stack_ffffffffffffff34.subsystem;
    LVar5._14_2_ = in_stack_ffffffffffffff34.code;
    flags_00.m_bits._4_2_ = in_stack_ffffffffffffff24;
    flags_00.m_bits._0_4_ = in_stack_ffffffffffffff20;
    flags_00.m_bits._6_1_ = in_stack_ffffffffffffff26;
    flags_00.m_bits._7_1_ = in_stack_ffffffffffffff27.m_bits;
    ASTContext::ASTContext((ASTContext *)in_RDI,(Scope *)pTVar3,LVar5,flags_00);
    local_8c = 0;
    bitmask<slang::ast::IntegralFlags>::bitmask(&local_8d);
    this_01 = (Type *)&in_RDI->canonical;
    diag = std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    arg = std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>::end
                    ((span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
                               *)pTVar3,
                              (__normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
                   *)&stack0xffffffffffffff60);
      PortSymbol::getType(in_stack_00000118);
      bVar1 = Type::isError((Type *)0x467d2a);
      if ((bVar1) || (bVar1 = Type::isUntypedType((Type *)0x467d38), bVar1)) {
        pTVar3 = Compilation::getErrorType(this_00);
        in_RDI[1].super_Symbol.name._M_str = (char *)pTVar3;
        return (Type *)in_RDI[1].super_Symbol.name._M_str;
      }
      bVar1 = Type::isIntegral(pTVar3);
      if (!bVar1) {
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_ffffffffffffff27.m_bits,
                                     CONCAT16(in_stack_ffffffffffffff26,
                                              CONCAT24(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20))),
                            in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
        ast::operator<<((Diagnostic *)diag._M_current,(Type *)arg._M_current);
        pTVar3 = Compilation::getErrorType(this_00);
        in_RDI[1].super_Symbol.name._M_str = (char *)pTVar3;
        return (Type *)in_RDI[1].super_Symbol.name._M_str;
      }
      bVar2 = Type::getBitWidth(in_RDI);
      in_stack_ffffffffffffff0c = bVar2 + local_8c;
      local_8c = in_stack_ffffffffffffff0c;
      SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag._M_current);
      in_stack_ffffffffffffff28 = SVar6.startLoc;
      in_stack_ffffffffffffff34 = SVar6.endLoc._4_4_;
      range.endLoc = in_stack_ffffffffffffff38;
      range.startLoc = SVar6.endLoc;
      bVar1 = ASTContext::requireValidBitWidth
                        ((ASTContext *)in_stack_ffffffffffffff28,
                         CONCAT13(in_stack_ffffffffffffff27.m_bits,
                                  CONCAT12(in_stack_ffffffffffffff26,in_stack_ffffffffffffff24)),
                         range);
      if (!bVar1) {
        pTVar3 = Compilation::getErrorType(this_00);
        in_RDI[1].super_Symbol.name._M_str = (char *)pTVar3;
        return (Type *)in_RDI[1].super_Symbol.name._M_str;
      }
      bVar1 = Type::isFourState(this_01);
      if (bVar1) {
        bitmask<slang::ast::IntegralFlags>::bitmask
                  ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffff27,FourState);
        bitmask<slang::ast::IntegralFlags>::operator|=
                  (&local_8d,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffff27);
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::PortSymbol_*const_*,_std::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff60);
    }
    if (local_8c == 0) {
      pTVar3 = Compilation::getErrorType(this_00);
      in_RDI[1].super_Symbol.name._M_str = (char *)pTVar3;
      local_8 = (Type *)in_RDI[1].super_Symbol.name._M_str;
    }
    else {
      pTVar3 = Compilation::getType
                         (this_00,in_stack_ffffffffffffffd4,
                          (bitmask<slang::ast::IntegralFlags>)
                          (underlying_type)((ulong)pSVar4 >> 0x38));
      in_RDI[1].super_Symbol.name._M_str = (char *)pTVar3;
      local_8 = (Type *)in_RDI[1].super_Symbol.name._M_str;
    }
  }
  else {
    local_8 = (Type *)in_RDI[1].super_Symbol.name._M_str;
  }
  return local_8;
}

Assistant:

const Type& MultiPortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto& comp = scope->getCompilation();

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    bitwidth_t totalWidth = 0;
    bitmask<IntegralFlags> flags;

    for (auto port : ports) {
        auto& t = port->getType();
        if (t.isError() || t.isUntypedType()) {
            type = &comp.getErrorType();
            return *type;
        }

        if (!t.isIntegral()) {
            context.addDiag(diag::BadConcatExpression, port->externalLoc) << t;
            type = &comp.getErrorType();
            return *type;
        }

        totalWidth += t.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax->sourceRange())) {
            type = &comp.getErrorType();
            return *type;
        }

        if (t.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (totalWidth == 0) {
        type = &comp.getErrorType();
        return *type;
    }

    type = &comp.getType(totalWidth, flags);
    return *type;
}